

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O3

CURLcode smb_send_setup(Curl_easy *data)

{
  uchar *plaintext;
  uint uVar1;
  connectdata *pcVar2;
  CURLcode CVar3;
  size_t sVar4;
  size_t sVar5;
  ulong uVar6;
  uchar lm [24];
  uchar nt_hash [21];
  uchar lm_hash [21];
  uchar nt [24];
  undefined2 local_44d;
  undefined3 local_44b;
  undefined4 uStack_448;
  undefined1 uStack_444;
  undefined1 uStack_443;
  undefined2 uStack_442;
  undefined2 uStack_440;
  undefined4 uStack_43e;
  undefined2 uStack_43a;
  undefined8 uStack_438;
  uchar local_430 [8];
  uchar auStack_428 [8];
  uchar local_420 [8];
  uchar local_418 [4];
  uchar auStack_414 [4];
  uchar auStack_410 [4];
  uchar auStack_40c [4];
  uchar local_408 [8];
  char local_400 [976];
  
  pcVar2 = data->conn;
  sVar4 = strlen((char *)(pcVar2->proto).rtspc.buf.leng);
  sVar5 = strlen((char *)(pcVar2->proto).rtspc.buf.allc);
  uVar6 = sVar4 + sVar5 + 0x3d;
  CVar3 = CURLE_FILESIZE_EXCEEDED;
  if (uVar6 < 0x401) {
    Curl_ntlm_core_mk_lm_hash(pcVar2->passwd,lm_hash);
    plaintext = (pcVar2->proto).smbc.challenge;
    Curl_ntlm_core_lm_resp(lm_hash,plaintext,lm);
    Curl_ntlm_core_mk_nt_hash(pcVar2->passwd,nt_hash);
    Curl_ntlm_core_lm_resp(nt_hash,plaintext,nt);
    local_44b = 0;
    uStack_43a = 0;
    local_44d = 0xff0d;
    uStack_448 = 0x19000;
    uStack_444 = 1;
    uStack_443 = 0;
    uVar1 = (pcVar2->proto).smbc.session_key;
    uStack_442 = (undefined2)uVar1;
    uStack_440 = (undefined2)(uVar1 >> 0x10);
    uStack_438 = 0x80000;
    uStack_43e = 0x180018;
    local_430[0] = lm[0];
    local_430[1] = lm[1];
    local_430[2] = lm[2];
    local_430[3] = lm[3];
    local_430[4] = lm[4];
    local_430[5] = lm[5];
    local_430[6] = lm[6];
    local_430[7] = lm[7];
    auStack_428[0] = lm[8];
    auStack_428[1] = lm[9];
    auStack_428[2] = lm[10];
    auStack_428[3] = lm[0xb];
    auStack_428[4] = lm[0xc];
    auStack_428[5] = lm[0xd];
    auStack_428[6] = lm[0xe];
    auStack_428[7] = lm[0xf];
    local_420[0] = lm[0x10];
    local_420[1] = lm[0x11];
    local_420[2] = lm[0x12];
    local_420[3] = lm[0x13];
    local_420[4] = lm[0x14];
    local_420[5] = lm[0x15];
    local_420[6] = lm[0x16];
    local_420[7] = lm[0x17];
    local_418[0] = nt[0];
    local_418[1] = nt[1];
    local_418[2] = nt[2];
    local_418[3] = nt[3];
    auStack_414[0] = nt[4];
    auStack_414[1] = nt[5];
    auStack_414[2] = nt[6];
    auStack_414[3] = nt[7];
    auStack_410[0] = nt[8];
    auStack_410[1] = nt[9];
    auStack_410[2] = nt[10];
    auStack_410[3] = nt[0xb];
    auStack_40c[0] = nt[0xc];
    auStack_40c[1] = nt[0xd];
    auStack_40c[2] = nt[0xe];
    auStack_40c[3] = nt[0xf];
    local_408[0] = nt[0x10];
    local_408[1] = nt[0x11];
    local_408[2] = nt[0x12];
    local_408[3] = nt[0x13];
    local_408[4] = nt[0x14];
    local_408[5] = nt[0x15];
    local_408[6] = nt[0x16];
    local_408[7] = nt[0x17];
    curl_msnprintf(local_400,sVar4 + sVar5 + 0xd,"%s%c%s%c%s%c%s",(pcVar2->proto).ftpc.pp.sendthis,0
                   ,(pcVar2->proto).ftpc.pp.sendleft,0,"Linux",0,"curl");
    uStack_438 = CONCAT26((short)uVar6,(undefined6)uStack_438);
    CVar3 = smb_send_message(data,'s',&local_44d,sVar4 + sVar5 + 0x5a);
  }
  return CVar3;
}

Assistant:

static CURLcode smb_send_setup(struct Curl_easy *data)
{
  struct connectdata *conn = data->conn;
  struct smb_conn *smbc = &conn->proto.smbc;
  struct smb_setup msg;
  char *p = msg.bytes;
  unsigned char lm_hash[21];
  unsigned char lm[24];
  unsigned char nt_hash[21];
  unsigned char nt[24];

  const size_t byte_count = sizeof(lm) + sizeof(nt) +
    strlen(smbc->user) + strlen(smbc->domain) +
    strlen(CURL_OS) + strlen(CLIENTNAME) + 4; /* 4 null chars */
  if(byte_count > sizeof(msg.bytes))
    return CURLE_FILESIZE_EXCEEDED;

  Curl_ntlm_core_mk_lm_hash(conn->passwd, lm_hash);
  Curl_ntlm_core_lm_resp(lm_hash, smbc->challenge, lm);
  Curl_ntlm_core_mk_nt_hash(conn->passwd, nt_hash);
  Curl_ntlm_core_lm_resp(nt_hash, smbc->challenge, nt);

  memset(&msg, 0, sizeof(msg) - sizeof(msg.bytes));
  msg.word_count = SMB_WC_SETUP_ANDX;
  msg.andx.command = SMB_COM_NO_ANDX_COMMAND;
  msg.max_buffer_size = smb_swap16(MAX_MESSAGE_SIZE);
  msg.max_mpx_count = smb_swap16(1);
  msg.vc_number = smb_swap16(1);
  msg.session_key = smb_swap32(smbc->session_key);
  msg.capabilities = smb_swap32(SMB_CAP_LARGE_FILES);
  msg.lengths[0] = smb_swap16(sizeof(lm));
  msg.lengths[1] = smb_swap16(sizeof(nt));
  memcpy(p, lm, sizeof(lm));
  p += sizeof(lm);
  memcpy(p, nt, sizeof(nt));
  p += sizeof(nt);
  p += msnprintf(p, byte_count - sizeof(nt) - sizeof(lm),
                 "%s%c"  /* user */
                 "%s%c"  /* domain */
                 "%s%c"  /* OS */
                 "%s", /* client name */
                 smbc->user, 0, smbc->domain, 0, CURL_OS, 0, CLIENTNAME);
  p++; /* count the final null termination */
  DEBUGASSERT(byte_count == (size_t)(p - msg.bytes));
  msg.byte_count = smb_swap16((unsigned short)byte_count);

  return smb_send_message(data, SMB_COM_SETUP_ANDX, &msg,
                          sizeof(msg) - sizeof(msg.bytes) + byte_count);
}